

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.c
# Opt level: O3

double getflt(void)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  double dVar4;
  double dVar5;
  char str [100];
  char local_78 [104];
  
  do {
    do {
      iVar2 = get();
    } while (iVar2 == 9);
  } while (iVar2 == 0x20);
  pcVar3 = local_78;
  while ((cVar1 = (char)iVar2, iVar2 - 0x30U < 10 || (cVar1 = '.', iVar2 == 0x2e))) {
    *pcVar3 = cVar1;
    iVar2 = get();
    pcVar3 = pcVar3 + 1;
  }
  if ((iVar2 == 0x2d) || (iVar2 == 0x2b)) {
    *pcVar3 = 'e';
    pcVar3[1] = (char)iVar2;
    pcVar3 = pcVar3 + 2;
    iVar2 = get();
    while (iVar2 - 0x30U < 10) {
      *pcVar3 = (char)iVar2;
      pcVar3 = pcVar3 + 1;
      iVar2 = get();
    }
  }
  *pcVar3 = '\0';
  dVar4 = atof(local_78);
  if (iVar2 == 0x7c) {
    dVar5 = getflt();
    dVar4 = dVar4 / dVar5;
    iVar2 = peekc;
  }
  peekc = iVar2;
  return dVar4;
}

Assistant:

static double getflt() {
	int c;
	char str[100];
	char* cp;
	double d_modern;

	cp = str;
	do
		c = get();
	while(c == ' ' || c == '\t');

l1:
	if(c >= '0' && c <= '9') {
		*cp++ = c;
		c = get();
		goto l1;
	}
	if(c == '.') {
		*cp++ = c;
		c = get();
		goto l1;
	}
	if(c == '+' || c == '-') {
		*cp++ = 'e';
		*cp++ = c;
		c = get();
		while(c >= '0' && c <= '9') {
			*cp++ = c;
			c = get();
		}
	}
	*cp = '\0';
	d_modern = atof(str);
	if(c == '|') {
		d_modern /= getflt();
		return d_modern;
	}
	peekc = c;
	return(d_modern);
}